

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O0

void burstsort2_sampling_superalphabet_vector(uchar **strings,size_t n)

{
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *root_00
  ;
  TrieNode<unsigned_short,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *root;
  size_t n_local;
  uchar **strings_local;
  
  root_00 = pseudo_sample<unsigned_short,std::vector<unsigned_char*,std::allocator<unsigned_char*>>>
                      (strings,n);
  insert<16384u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,BurstSimple<unsigned_short>,unsigned_short>
            (root_00,strings,n);
  traverse<void(*)(unsigned_char**,int,int),std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
            (root_00,strings,0,mkqsort);
  return;
}

Assistant:

void burstsort2_sampling_superalphabet_vector(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef std::vector<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<16384, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}